

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_mtree.c
# Opt level: O0

void test_read_format_mtree_nomagic_v1_form(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a_00;
  FILE *__s;
  size_t v2;
  char *pcVar4;
  la_int64_t lVar5;
  la_ssize_t v2_00;
  FILE *f;
  archive *a;
  archive_entry *ae;
  char buff [16];
  char reffile [37];
  
  memcpy(buff + 8,"test_read_format_mtree_nomagic.mtree",0x25);
  extract_reference_file(buff + 8);
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'ȗ',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                   ,(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ș',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ț',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a_00);
  iVar1 = archive_read_set_options((archive *)a_00,"mtree:checkfs");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȝ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_options(a, \"mtree:checkfs\")",a_00);
  wVar2 = archive_read_open_filename(a_00,buff + 8,0xb);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȟ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, reffile, 11)"
                      ,a_00);
  __s = fopen("file","wb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'ȥ',(uint)(__s != (FILE *)0x0),"f != NULL",(void *)0x0);
  v2 = fwrite("hi\n",1,3,__s);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȧ',3,"3",v2,"fwrite(\"hi\\n\", 1, 3, f)",(void *)0x0);
  fclose(__s);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_format((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȩ',(long)iVar1,"archive_format(a)",0x80000,"ARCHIVE_FORMAT_MTREE",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'Ȫ',pcVar4,"archive_entry_pathname(ae)","file","\"file\"",(void *)0x0,L'\0');
  lVar5 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȫ',lVar5,"archive_entry_uid(ae)",0x12,"18",(void *)0x0);
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȭ',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȭ',(ulong)mVar3,"archive_entry_mode(ae)",0x8053,"AE_IFREG | 0123",
                      (void *)0x0);
  lVar5 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȯ',lVar5,"archive_entry_size(ae)",3,"3",(void *)0x0);
  v2_00 = archive_read_data((archive *)a_00,&ae,3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȯ',3,"3",v2_00,"archive_read_data(a, buff, 3)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȱ',&ae,"buff","hi\n","\"hi\\n\"",3,"3",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȱ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȳ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȴ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ȵ',pcVar4,"archive_entry_pathname(ae)","dir","\"dir\"",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȶ',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȷ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȸ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ⱥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'Ȼ',pcVar4,"archive_entry_pathname(ae)","dir/file with space",
             "\"dir/file with space\"",(void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȼ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ƚ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȿ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ɀ',pcVar4,"archive_entry_pathname(ae)","file with space","\"file with space\"",
             (void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ɂ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɂ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ʉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'Ʌ',pcVar4,"archive_entry_pathname(ae)","dir2","\"dir2\"",(void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ɇ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɇ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'Ɋ',pcVar4,"archive_entry_pathname(ae)","dir2/dir3a","\"dir2/dir3a\"",(void *)0x0,
             L'\0');
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɋ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ɍ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ɏ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ɏ',pcVar4,"archive_entry_pathname(ae)","dir2/dir3a/indir3a",
             "\"dir2/dir3a/indir3a\"",(void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɐ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɑ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɓ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ɔ',pcVar4,"archive_entry_pathname(ae)","dir2/fullindir2","\"dir2/fullindir2\"",
             (void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɕ',(ulong)mVar3,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɖ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɗ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ə',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ɚ',pcVar4,"archive_entry_pathname(ae)","dir2/indir2","\"dir2/indir2\"",(void *)0x0,
             L'\0');
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɛ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɜ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɞ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ɟ',pcVar4,"archive_entry_pathname(ae)","dir2/dir3b","\"dir2/dir3b\"",(void *)0x0,
             L'\0');
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɠ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɡ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɣ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ɤ',pcVar4,"archive_entry_pathname(ae)","dir2/dir3b/indir3b",
             "\"dir2/dir3b/indir3b\"",(void *)0x0,L'\0');
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɥ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɦ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɨ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ɩ',pcVar4,"archive_entry_pathname(ae)","notindir","\"notindir\"",(void *)0x0,L'\0')
  ;
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɪ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɫ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɭ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_file_count((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɮ',0xc,"12",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɯ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ɰ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_mtree_nomagic_v1_form)
{
	const char reffile[] = "test_read_format_mtree_nomagic.mtree";
	char buff[16];
	struct archive_entry *ae;
	struct archive *a;
	FILE *f;

	extract_reference_file(reffile);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "mtree:checkfs"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reffile, 11));

	/*
	 * Read "file", whose data is available on disk.
	 */
	f = fopen("file", "wb");
	assert(f != NULL);
	assertEqualInt(3, fwrite("hi\n", 1, 3, f));
	fclose(f);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_MTREE);
	assertEqualString(archive_entry_pathname(ae), "file");
	assertEqualInt(archive_entry_uid(ae), 18);
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0123);
	assertEqualInt(archive_entry_size(ae), 3);
	assertEqualInt(3, archive_read_data(a, buff, 3));
	assertEqualMem(buff, "hi\n", 3);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir");
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir/file with space");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "file with space");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/dir3a");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/dir3a/indir3a");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/fullindir2");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/indir2");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/dir3b");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/dir3b/indir3b");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "notindir");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(12, archive_file_count(a));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}